

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_mesh * rf_gen_mesh_heightmap
                    (rf_mesh *__return_storage_ptr__,rf_image heightmap,rf_vec3 size,
                    rf_allocator allocator,rf_allocator temp_allocator)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  rf_source_location rVar4;
  rf_source_location rVar5;
  rf_source_location rVar6;
  rf_source_location rVar7;
  rf_source_location rVar8;
  rf_allocator_args rVar9;
  rf_allocator_args rVar10;
  undefined1 auVar11 [24];
  undefined1 auVar12 [24];
  undefined1 auVar13 [24];
  uint uVar14;
  rf_int i;
  uint *puVar15;
  rf_color *prVar16;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  float *pfVar28;
  long lVar29;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar41;
  undefined1 auVar40 [16];
  uint uStack_144;
  uint uStack_114;
  uint uStack_e4;
  uint uStack_b4;
  uint uStack_84;
  rf_allocator temp_allocator_local;
  rf_allocator allocator_local;
  ulong uVar17;
  
  temp_allocator_local.allocator_proc = temp_allocator.allocator_proc;
  temp_allocator_local.user_data = temp_allocator.user_data;
  allocator_local.allocator_proc = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  auVar40._8_4_ = in_XMM0_Dc;
  auVar40._0_8_ = size._0_8_;
  auVar40._12_4_ = in_XMM0_Dd;
  __return_storage_ptr__->bone_weights = (float *)0x0;
  *(undefined8 *)&__return_storage_ptr__->vao_id = 0;
  __return_storage_ptr__->anim_normals = (float *)0x0;
  __return_storage_ptr__->bone_ids = (int *)0x0;
  __return_storage_ptr__->indices = (unsigned_short *)0x0;
  __return_storage_ptr__->anim_vertices = (float *)0x0;
  __return_storage_ptr__->tangents = (float *)0x0;
  __return_storage_ptr__->colors = (uchar *)0x0;
  __return_storage_ptr__->texcoords2 = (float *)0x0;
  __return_storage_ptr__->normals = (float *)0x0;
  rVar4.proc_name = "rf_gen_mesh_heightmap";
  rVar4.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar4.line_in_file = 0x891d;
  rVar9._16_8_ = (ulong)uStack_84 << 0x20;
  rVar9.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar9.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  puVar15 = (uint *)(*allocator_local.allocator_proc)(&allocator_local,rVar4,RF_AM_ALLOC,rVar9);
  __return_storage_ptr__->vbo_id = puVar15;
  puVar15[0] = 0;
  puVar15[1] = 0;
  puVar15[2] = 0;
  puVar15[3] = 0;
  puVar15[3] = 0;
  puVar15[4] = 0;
  puVar15[5] = 0;
  puVar15[6] = 0;
  prVar16 = rf_image_pixels_to_rgba32(heightmap,temp_allocator);
  uVar26 = heightmap.width - 1;
  uVar14 = heightmap.height - 1;
  uVar17 = (ulong)uVar14;
  iVar27 = uVar14 * uVar26;
  __return_storage_ptr__->triangle_count = iVar27 * 2;
  __return_storage_ptr__->vertex_count = iVar27 * 6;
  lVar22 = (long)(iVar27 * 0x12) << 2;
  rVar5.proc_name = "rf_gen_mesh_heightmap";
  rVar5.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar5.line_in_file = 0x892a;
  auVar11._8_8_ = (ulong)uStack_b4 << 0x20;
  auVar11._0_8_ = lVar22;
  auVar11._16_8_ = 0;
  pfVar18 = (float *)(*allocator_local.allocator_proc)
                               (&allocator_local,rVar5,RF_AM_ALLOC,
                                (rf_allocator_args)(auVar11 << 0x40));
  __return_storage_ptr__->vertices = pfVar18;
  rVar6.proc_name = "rf_gen_mesh_heightmap";
  rVar6.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar6.line_in_file = 0x892b;
  auVar12._8_8_ = (ulong)uStack_e4 << 0x20;
  auVar12._0_8_ = lVar22;
  auVar12._16_8_ = 0;
  pfVar18 = (float *)(*allocator_local.allocator_proc)
                               (&allocator_local,rVar6,RF_AM_ALLOC,
                                (rf_allocator_args)(auVar12 << 0x40));
  __return_storage_ptr__->normals = pfVar18;
  rVar7.proc_name = "rf_gen_mesh_heightmap";
  rVar7.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar7.line_in_file = 0x892c;
  auVar13._8_8_ = (ulong)uStack_114 << 0x20;
  auVar13._0_8_ = (long)(iVar27 * 0xc) << 2;
  auVar13._16_8_ = 0;
  pfVar18 = (float *)(*allocator_local.allocator_proc)
                               (&allocator_local,rVar7,RF_AM_ALLOC,
                                (rf_allocator_args)(auVar13 << 0x40));
  __return_storage_ptr__->texcoords = pfVar18;
  __return_storage_ptr__->colors = (uchar *)0x0;
  auVar2._4_4_ = 0x437f0000;
  auVar2._0_4_ = (float)heightmap.width;
  auVar2._8_8_ = 0;
  auVar40 = divps(auVar40,auVar2);
  fVar41 = auVar40._4_4_;
  fVar39 = size.z / (float)heightmap.height;
  uVar3 = uVar26;
  if ((int)uVar26 < 1) {
    uVar3 = 0;
  }
  if ((int)uVar14 < 1) {
    uVar17 = 0;
  }
  lVar22 = 0;
  lVar23 = 0;
  lVar24 = 0;
  uVar20 = 0;
  while (uVar20 != uVar17) {
    pfVar1 = __return_storage_ptr__->vertices;
    lVar29 = uVar20 * (long)heightmap.width;
    fVar30 = (float)(long)uVar20;
    fVar31 = fVar39 * fVar30;
    uVar20 = uVar20 + 1;
    lVar25 = uVar20 * (long)heightmap.width;
    fVar33 = fVar39 * (float)(long)uVar20;
    fVar30 = fVar30 / (float)(int)uVar14;
    fVar32 = (float)(long)uVar20 / (float)(int)uVar14;
    lVar22 = (long)(int)lVar22;
    lVar23 = (long)(int)lVar23;
    lVar24 = (long)(int)lVar24;
    pfVar28 = __return_storage_ptr__->normals + lVar22 + 2;
    uVar21 = 0;
    while (uVar21 != uVar3) {
      fVar35 = (float)(long)uVar21 * auVar40._0_4_;
      *(ulong *)(pfVar1 + lVar24) =
           CONCAT44((float)(int)(short)((ushort)((ushort)prVar16[uVar21 + lVar29].b +
                                                (ushort)prVar16[uVar21 + lVar29].g +
                                                (ushort)prVar16[uVar21 + lVar29].r) / 3) * fVar41,
                    fVar35);
      pfVar1[lVar24 + 2] = fVar31;
      pfVar1[lVar24 + 3] = fVar35;
      fVar36 = (float)(int)(short)((ushort)((ushort)prVar16[uVar21 + lVar25].b +
                                           (ushort)prVar16[uVar21 + lVar25].g +
                                           (ushort)prVar16[uVar21 + lVar25].r) / 3) * fVar41;
      pfVar1[lVar24 + 4] = fVar36;
      pfVar1[lVar24 + 5] = fVar33;
      fVar34 = (float)(long)(uVar21 + 1);
      fVar37 = fVar34 * auVar40._0_4_;
      fVar38 = (float)(int)(short)((ushort)((ushort)prVar16[uVar21 + lVar29 + 1].b +
                                           (ushort)prVar16[uVar21 + lVar29 + 1].g +
                                           (ushort)prVar16[uVar21 + lVar29 + 1].r) / 3) * fVar41;
      *(ulong *)(pfVar1 + lVar24 + 6) = CONCAT44(fVar38,fVar37);
      pfVar1[lVar24 + 8] = fVar31;
      *(ulong *)(pfVar1 + lVar24 + 9) = CONCAT44(fVar38,fVar37);
      pfVar1[lVar24 + 0xb] = fVar31;
      pfVar1[lVar24 + 0xc] = fVar35;
      pfVar1[lVar24 + 0xd] = fVar36;
      pfVar1[lVar24 + 0xe] = fVar33;
      pfVar1[lVar24 + 0xf] = fVar37;
      pfVar1[lVar24 + 0x10] =
           (float)(int)(short)((ushort)((ushort)prVar16[uVar21 + lVar25 + 1].b +
                                       (ushort)prVar16[uVar21 + lVar25 + 1].g +
                                       (ushort)prVar16[uVar21 + lVar25 + 1].r) / 3) * fVar41;
      pfVar1[lVar24 + 0x11] = fVar33;
      fVar35 = (float)(long)uVar21 / (float)(int)uVar26;
      pfVar18[lVar23] = fVar35;
      pfVar18[lVar23 + 1] = fVar30;
      pfVar18[lVar23 + 2] = fVar35;
      pfVar18[lVar23 + 3] = fVar32;
      fVar34 = fVar34 / (float)(int)uVar26;
      pfVar18[lVar23 + 4] = fVar34;
      pfVar18[lVar23 + 5] = fVar30;
      pfVar18[lVar23 + 6] = fVar34;
      pfVar18[lVar23 + 7] = fVar30;
      pfVar18[lVar23 + 8] = fVar35;
      pfVar18[lVar23 + 9] = fVar32;
      pfVar18[lVar23 + 10] = fVar34;
      pfVar18[lVar23 + 0xb] = fVar32;
      for (uVar19 = 0; uVar19 < 0x12; uVar19 = uVar19 + 3) {
        (pfVar28 + (uVar19 - 2))[0] = 0.0;
        (pfVar28 + (uVar19 - 2))[1] = 1.0;
        pfVar28[uVar19] = 0.0;
      }
      lVar24 = lVar24 + 0x12;
      lVar23 = lVar23 + 0xc;
      lVar22 = lVar22 + 0x12;
      pfVar28 = pfVar28 + 0x12;
      uVar21 = uVar21 + 1;
    }
  }
  rVar8.proc_name = "rf_gen_mesh_heightmap";
  rVar8.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar8.line_in_file = 0x897e;
  rVar10.size_to_allocate_or_reallocate = 0;
  rVar10.pointer_to_free_or_realloc = prVar16;
  rVar10._16_8_ = (ulong)uStack_144 << 0x20;
  (*temp_allocator_local.allocator_proc)(&temp_allocator_local,rVar8,RF_AM_FREE,rVar10);
  rf_gfx_load_mesh(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mesh rf_gen_mesh_heightmap(rf_image heightmap, rf_vec3 size, rf_allocator allocator, rf_allocator temp_allocator)
{
#define RF_GRAY_VALUE(c) ((c.r+c.g+c.b)/3)

    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    int map_x = heightmap.width;
    int map_z = heightmap.height;

    rf_color* pixels = rf_image_pixels_to_rgba32(heightmap, temp_allocator);

    // NOTE: One vertex per pixel
    mesh.triangle_count = (map_x - 1) * (map_z - 1) * 2; // One quad every four pixels

    mesh.vertex_count = mesh.triangle_count * 3;

    mesh.vertices  = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.normals   = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.texcoords = (float*) RF_ALLOC(allocator, mesh.vertex_count * 2 * sizeof(float));
    mesh.colors    = NULL;

    int vertex_pos_counter      = 0; // Used to count vertices float by float
    int vertex_texcoord_counter = 0; // Used to count texcoords float by float
    int n_counter               = 0; // Used to count normals float by float
    int tris_counter            = 0;

    rf_vec3 scale_factor = { size.x / map_x, size.y / 255.0f, size.z / map_z };

    for (rf_int z = 0; z < map_z-1; z++)
    {
        for (rf_int x = 0; x < map_x-1; x++)
        {
            // Fill vertices array with data
            //----------------------------------------------------------

            // one triangle - 3 vertex
            mesh.vertices[vertex_pos_counter    ] = (float) x * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 1] = (float) RF_GRAY_VALUE(pixels[x + z * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 2] = (float) z * scale_factor.z;

            mesh.vertices[vertex_pos_counter + 3] = (float) x * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 4] = (float) RF_GRAY_VALUE(pixels[x + (z + 1) * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 5] = (float) (z + 1) * scale_factor.z;

            mesh.vertices[vertex_pos_counter + 6] = (float)(x + 1) * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 7] = (float)RF_GRAY_VALUE(pixels[(x + 1) + z * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 8] = (float)z * scale_factor.z;

            // another triangle - 3 vertex
            mesh.vertices[vertex_pos_counter + 9 ] = mesh.vertices[vertex_pos_counter + 6];
            mesh.vertices[vertex_pos_counter + 10] = mesh.vertices[vertex_pos_counter + 7];
            mesh.vertices[vertex_pos_counter + 11] = mesh.vertices[vertex_pos_counter + 8];

            mesh.vertices[vertex_pos_counter + 12] = mesh.vertices[vertex_pos_counter + 3];
            mesh.vertices[vertex_pos_counter + 13] = mesh.vertices[vertex_pos_counter + 4];
            mesh.vertices[vertex_pos_counter + 14] = mesh.vertices[vertex_pos_counter + 5];

            mesh.vertices[vertex_pos_counter + 15] = (float)(x + 1) * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 16] = (float)RF_GRAY_VALUE(pixels[(x + 1) + (z + 1) * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 17] = (float)(z + 1) * scale_factor.z;
            vertex_pos_counter += 18; // 6 vertex, 18 floats

            // Fill texcoords array with data
            //--------------------------------------------------------------
            mesh.texcoords[vertex_texcoord_counter    ] = (float)x / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 1] = (float)z / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 2] = (float)x / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 3] = (float)(z + 1) / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 4] = (float)(x + 1) / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 5] = (float)z / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 6] = mesh.texcoords[vertex_texcoord_counter + 4];
            mesh.texcoords[vertex_texcoord_counter + 7] = mesh.texcoords[vertex_texcoord_counter + 5];

            mesh.texcoords[vertex_texcoord_counter + 8] = mesh.texcoords[vertex_texcoord_counter + 2];
            mesh.texcoords[vertex_texcoord_counter + 9] = mesh.texcoords[vertex_texcoord_counter + 3];

            mesh.texcoords[vertex_texcoord_counter + 10] = (float)(x + 1) / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 11] = (float)(z + 1) / (map_z - 1);

            vertex_texcoord_counter += 12; // 6 texcoords, 12 floats

            // Fill normals array with data
            //--------------------------------------------------------------
            for (rf_int i = 0; i < 18; i += 3)
            {
                mesh.normals[n_counter + i    ] = 0.0f;
                mesh.normals[n_counter + i + 1] = 1.0f;
                mesh.normals[n_counter + i + 2] = 0.0f;
            }

            // TODO: Calculate normals in an efficient way

            n_counter    += 18; // 6 vertex, 18 floats
            tris_counter += 2;
        }
    }

    RF_FREE(temp_allocator, pixels);

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}